

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pointer __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::alloc_impl<google::libc_allocator_with_realloc<A>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<A>_> *this,pointer ptr,size_type n)

{
  pointer pAVar1;
  ulong uVar2;
  int iVar3;
  pointer pAVar4;
  long lVar5;
  
  pAVar1 = (pointer)realloc(ptr,n * 4);
  if (pAVar1 != (pointer)0x0) {
    return pAVar1;
  }
  dense_hashtable<A,A,HashA,google::dense_hash_set<A,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<A>>::Identity,google::dense_hash_set<A,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<A>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<A>>
  ::alloc_impl<google::libc_allocator_with_realloc<A>>::realloc_or_die();
  uVar2 = *(long *)(n + 0x38) - 1;
  pAVar1 = (pointer)(uVar2 & (long)ptr->_i);
  iVar3 = *(int *)(*(long *)(n + 0x48) + (long)pAVar1 * 4);
  if (*(int *)(n + 0x24) != iVar3) {
    pAVar4 = (pointer)0xffffffffffffffff;
    lVar5 = 1;
    do {
      if ((*(long *)(n + 0x28) == 0) || (*(int *)(n + 0x20) != iVar3)) {
        if (ptr->_i == iVar3) {
          return pAVar1;
        }
      }
      else if (pAVar4 == (pointer)0xffffffffffffffff) {
        pAVar4 = pAVar1;
      }
      pAVar1 = (pointer)((long)&pAVar1->_i + lVar5 & uVar2);
      iVar3 = *(int *)(*(long *)(n + 0x48) + (long)pAVar1 * 4);
      lVar5 = lVar5 + 1;
    } while (*(int *)(n + 0x24) != iVar3);
  }
  return (pointer)0xffffffffffffffff;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }